

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat format,IVec2 *size,deUint32 numLayers,
          VkSampleCountFlagBits samples,VkImageUsageFlags usage)

{
  VkImageCreateInfo local_60;
  
  local_60.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.imageType = VK_IMAGE_TYPE_2D;
  local_60.extent._0_8_ = *(undefined8 *)size->m_data;
  local_60.extent.depth = 1;
  local_60.mipLevels = 1;
  local_60.samples = samples;
  local_60.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_60.usage = usage;
  local_60.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_60.queueFamilyIndexCount = 0;
  local_60.pQueueFamilyIndices = (deUint32 *)0x0;
  local_60.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_60.format = format;
  local_60.arrayLayers = numLayers;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_60,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface& vk, const VkDevice device, const VkFormat format, const IVec2& size, const deUint32 numLayers, const VkSampleCountFlagBits samples, const VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageCreateFlags)0,							// VkImageCreateFlags		flags;
		VK_IMAGE_TYPE_2D,								// VkImageType				imageType;
		format,											// VkFormat					format;
		makeExtent3D(size.x(), size.y(), 1),			// VkExtent3D				extent;
		1u,												// deUint32					mipLevels;
		numLayers,										// deUint32					arrayLayers;
		samples,										// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,						// VkImageTiling			tiling;
		usage,											// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,						// VkSharingMode			sharingMode;
		0u,												// deUint32					queueFamilyIndexCount;
		DE_NULL,										// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}